

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_OpdatasetGetActive_Test::TestBody
          (InterpreterTestSuite_PC_OpdatasetGetActive_Test *this)

{
  _Manager_type *pp_Var1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string *this_00;
  PersistentStorage *pPVar4;
  size_type sVar5;
  undefined8 uVar6;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar7;
  json_value jVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  int iVar11;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *pTVar12;
  reference this_01;
  _Manager_operation _Var13;
  _func_void__Any_data_ptr_ActiveOperationalDataset_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  char *pcVar14;
  pointer *__ptr;
  pointer pbVar15;
  char *expected_predicate_value;
  initializer_list<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>
  __l;
  string jsonStr;
  Action<void_(ot::commissioner::ActiveOperationalDataset_&)> converted;
  AssertionResult gtest_ar_2;
  undefined1 local_370 [8];
  undefined1 local_368 [16];
  _Alloc_hider local_358;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  element_type local_348 [2];
  json json;
  NetworkId nwk_id;
  AssertionResult gtest_ar_7;
  Expression expr;
  _Invoker_type p_Stack_2d0;
  Value value;
  Matcher<ot::commissioner::ActiveOperationalDataset_&> local_280;
  testing local_268 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  Matcher<unsigned_short> local_258;
  ReturnAction local_240 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  Network nwk;
  _Any_data local_1c8;
  code *local_1b8;
  undefined8 uStack_1b0;
  string local_1a8;
  Error local_188;
  TestContext ctx;
  
  _Var13 = (_Manager_operation)&jsonStr;
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&nwk_id);
  pPVar4 = (ctx.mRegistry)->mStorage;
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&converted,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&expr,0xffffffff);
  psVar2 = &value.mError.mMessage._M_string_length;
  value.mError._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"");
  pcVar14 = "";
  gtest_ar_2._0_8_ = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"","");
  expected_predicate_value = (char *)0x0;
  ot::commissioner::persistent_storage::Network::Network
            (&nwk,(NetworkId *)&converted,(DomainId *)&expr,(string *)&value,1,0,0,
             (string *)&gtest_ar_2,0);
  iVar11 = (*pPVar4->_vptr_PersistentStorage[6])(pPVar4,&nwk,&nwk_id);
  json.m_type = (value_t)iVar11;
  gtest_ar_7._0_8_ = gtest_ar_7._0_8_ & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&jsonStr,
             "ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, \"\", 1, 0, 0, \"\", 0}, nwk_id)"
             ,"PersistentStorage::Status::kSuccess",&json.m_type,&gtest_ar_7.success_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
    operator_delete(nwk.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
    operator_delete(nwk.mName._M_dataplus._M_p);
  }
  if ((undefined1 *)gtest_ar_2._0_8_ != local_370) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if ((size_type *)value.mError._0_8_ != psVar2) {
    operator_delete((void *)value.mError._0_8_);
  }
  if ((char)jsonStr._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&nwk);
    if (jsonStr._M_string_length != 0) {
      pcVar14 = *(char **)jsonStr._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76c,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
  }
  if (jsonStr._M_string_length != 0) {
    if (*(void **)jsonStr._M_string_length != (void *)(jsonStr._M_string_length + 0x10)) {
      operator_delete(*(void **)jsonStr._M_string_length);
    }
    operator_delete((void *)jsonStr._M_string_length);
  }
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  iVar11 = (*(ctx.mRegistry)->mStorage->_vptr_PersistentStorage[0xe])
                     ((ctx.mRegistry)->mStorage,&nwk_id,&nwk);
  gtest_ar_2.success_ = SUB41(iVar11,0);
  jsonStr._M_dataplus._M_p = jsonStr._M_dataplus._M_p & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&value,"ctx.mRegistry->mStorage->Get(nwk_id, nwk)",
             "PersistentStorage::Status::kSuccess",&gtest_ar_2.success_,(Status *)&jsonStr);
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&jsonStr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76e,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&jsonStr,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&jsonStr);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  _Var9._M_p = value.mError.mMessage._M_dataplus._M_p;
  if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*value.mError.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var9._M_p);
  }
  ot::commissioner::utils::Hex<unsigned_short>((string *)&value,nwk.mPan);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            ((internal *)&gtest_ar_2,"utils::Hex(nwk.mPan)","\"0x0000\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
             (char (*) [7])"0x0000");
  if ((size_type *)value.mError._0_8_ != psVar2) {
    operator_delete((void *)value.mError._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&value);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&jsonStr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76f,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&jsonStr,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&jsonStr);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if (*(void **)gtest_ar_2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
        (void *)((long)gtest_ar_2.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x10)) {
      operator_delete(*(void **)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    }
    operator_delete((void *)gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a7b90;
  local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a21f8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset&>const*>
            (&local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a21b0;
  local_258.super_MatcherBase<unsigned_short>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_258.super_MatcherBase<unsigned_short>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a3618;
  local_258.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a0a20;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
            (&local_258.super_MatcherBase<unsigned_short>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_258.super_MatcherBase<unsigned_short>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_258.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a09d8;
  CommissionerAppMock::gmock_GetActiveDataset
            ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              *)&gtest_ar_2,
             ctx.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_280,
             &local_258);
  testing::internal::GetWithoutMatchers();
  pTVar12 = testing::internal::
            MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
            ::InternalExpectedAt
                      ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        *)&gtest_ar_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x771,"*ctx.mDefaultCommissionerObject","GetActiveDataset(_, _)");
  pTVar12 = testing::internal::
            TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
            ::Times(pTVar12,2);
  paVar3 = &local_188.mMessage.field_2;
  local_188.mCode = kNone;
  local_188.mMessage._M_string_length = 0;
  local_188.mMessage.field_2._M_local_buf[0] = '\0';
  local_188.mMessage._M_dataplus._M_p = (pointer)paVar3;
  testing::Return<ot::commissioner::Error>(local_268,&local_188);
  if (local_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_260->_M_use_count = local_260->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_260->_M_use_count = local_260->_M_use_count + 1;
    }
  }
  local_238 = local_260;
  converted.fun_._M_invoker =
       std::
       _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1907:42)>
       ::_M_invoke;
  converted.fun_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1907:42)>
       ::_M_manager;
  converted.fun_.super__Function_base._M_functor._8_8_ = 0;
  converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  jsonStr.field_2._8_8_ = 0;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr._M_string_length = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  std::function<void_(ot::commissioner::ActiveOperationalDataset_&)>::function
            ((function<void_(ot::commissioner::ActiveOperationalDataset_&)> *)&expr,&converted.fun_)
  ;
  json.m_type = null;
  json._1_7_ = 0;
  json.m_value.object = (object_t *)0x0;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr.field_2._8_8_ = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  jsonStr._M_string_length = 0;
  json._0_8_ = operator_new(0x20);
  *(undefined8 *)json._0_8_ = 0;
  *(undefined8 *)(json._0_8_ + 8) = 0;
  *(undefined8 *)(json._0_8_ + 0x10) = 0;
  *(_Invoker_type *)(json._0_8_ + 0x18) = p_Stack_2d0;
  if (expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    *(pointer *)json._0_8_ =
         expr.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(json._0_8_ + 8) =
         expr.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(json._0_8_ + 0x10) =
         expr.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    expr.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  json.m_value.number_unsigned = jsonStr._M_string_length;
  jsonStr.field_2._8_8_ = 0;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr._M_string_length = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  if (expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(&expr,&expr,3);
  }
  if (converted.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*converted.fun_.super__Function_base._M_manager)
              ((_Any_data *)&converted,(_Any_data *)&converted,__destroy_functor);
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&json;
  std::
  vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
  ::vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
            *)&value,__l,(allocator_type *)&jsonStr);
  std::_Function_handler::operator_cast_to_Action
            ((_Function_handler *)&json,(_Any_data *)&json,(_Any_data *)0x3,_Var13);
  __return_storage_ptr__ = &value.mError.mMessage.field_2;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              *)__return_storage_ptr__,local_240);
  gtest_ar_7.success_ = false;
  gtest_ar_7._1_7_ = 0;
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr.field_2._8_8_ = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  jsonStr._M_string_length = 0;
  gtest_ar_7._0_8_ = operator_new(0x38);
  *(undefined8 *)gtest_ar_7._0_8_ = value.mError._0_8_;
  *(pointer *)(gtest_ar_7._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p;
  *(size_type *)(gtest_ar_7._0_8_ + 0x10) = value.mError.mMessage._M_string_length;
  *(undefined8 *)(gtest_ar_7._0_8_ + 0x28) = 0;
  *(undefined8 *)(gtest_ar_7._0_8_ + 0x18) = 0;
  *(undefined8 *)(gtest_ar_7._0_8_ + 0x20) = 0;
  *(size_type *)(gtest_ar_7._0_8_ + 0x30) = value.mData._M_string_length;
  if (value.mData._M_dataplus._M_p != (pointer)0x0) {
    *(ulong *)(gtest_ar_7._0_8_ + 0x18) =
         CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                  value.mError.mMessage.field_2._M_local_buf[0]);
    *(undefined8 *)(gtest_ar_7._0_8_ + 0x20) = value.mError.mMessage.field_2._8_8_;
    *(pointer *)(gtest_ar_7._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
    value.mData._M_dataplus._M_p = (pointer)0x0;
    value.mData._M_string_length = 0;
  }
  _Var13 = 0x1ab614;
  value.mError.mMessage._M_string_length = 0;
  value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
  value.mError.mCode = kNone;
  value.mError._4_4_ = 0;
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )jsonStr._M_string_length;
  jsonStr.field_2._8_8_ = 0;
  jsonStr.field_2._M_allocated_capacity = 0;
  jsonStr._M_string_length = 0;
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  if (value.mData._M_dataplus._M_p != (pointer)0x0) {
    (*(code *)value.mData._M_dataplus._M_p)(__return_storage_ptr__,__return_storage_ptr__,3);
  }
  std::
  vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
  ::~vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
             *)&value);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  ::WillRepeatedly(pTVar12,(Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                            *)&gtest_ar_7);
  std::_Function_handler::operator_cast_to_Action
            ((_Function_handler *)&gtest_ar_7,(_Any_data *)&gtest_ar_7,(_Any_data *)0x3,_Var13);
  if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
  }
  if (local_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.mMessage._M_dataplus._M_p != paVar3) {
    operator_delete(local_188.mMessage._M_dataplus._M_p);
  }
  local_368._8_8_ = &PTR__MatcherBase_003a21f8;
  if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
  }
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )&PTR__MatcherBase_003a0a20;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._0_8_);
  }
  local_258.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a0a20;
  if (local_258.super_MatcherBase<unsigned_short>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super_MatcherBase<unsigned_short>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a21f8;
  if (local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar3 = &value.mData.field_2;
  value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
  value.mError.mMessage._M_string_length = 0;
  value.mError.mMessage.field_2._M_local_buf[0] = '\0';
  value.mData._M_string_length = 0;
  value.mData.field_2._M_local_buf[0] = '\0';
  gtest_ar_2._0_8_ = local_370;
  value.mError.mMessage._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  value.mData._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"opdataset get active","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&converted,&ctx.mInterpreter,(string *)&gtest_ar_2);
  jsonStr.field_2._M_allocated_capacity =
       (size_type)
       expr.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  jsonStr._M_string_length =
       (size_type)
       expr.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  jsonStr._M_dataplus._M_p =
       (pointer)expr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)converted.fun_.super__Function_base._M_functor._M_unused._0_8_;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)converted.fun_.super__Function_base._M_functor._8_8_;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)converted.fun_.super__Function_base._M_manager;
  converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  converted.fun_.super__Function_base._M_functor._8_8_ = 0;
  converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&jsonStr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&converted);
  if ((undefined1 *)gtest_ar_2._0_8_ != local_370) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_2,&ctx.mInterpreter,&expr);
  this_00 = &value.mError.mMessage;
  value.mError.mCode = gtest_ar_2._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&gtest_ar_2.message_);
  std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_358);
  if ((element_type *)local_358._M_p != local_348) {
    operator_delete(local_358._M_p);
  }
  if (gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_368) {
    operator_delete((void *)gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  bVar10 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  jsonStr._M_dataplus._M_p._0_1_ = bVar10;
  jsonStr._M_string_length = 0;
  if (!bVar10) {
    testing::Message::Message((Message *)&converted);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&jsonStr,(AssertionResult *)0x2e6ffe,"false","true"
               ,expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&json,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x780,(char *)gtest_ar_2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&json,(Message *)&converted);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&json);
    if ((undefined1 *)gtest_ar_2._0_8_ != local_370) {
      operator_delete((void *)gtest_ar_2._0_8_);
    }
    if (converted.fun_.super__Function_base._M_functor._M_unused._M_object != (void *)0x0) {
      (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object + 8))();
    }
  }
  sVar5 = jsonStr._M_string_length;
  if (jsonStr._M_string_length != 0) {
    if (*(void **)jsonStr._M_string_length != (void *)(jsonStr._M_string_length + 0x10)) {
      operator_delete(*(void **)jsonStr._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  iVar11 = (*(ctx.mRegistry)->mStorage->_vptr_PersistentStorage[0xe])
                     ((ctx.mRegistry)->mStorage,&nwk_id,&nwk);
  jsonStr._M_dataplus._M_p._0_1_ = (char)iVar11;
  converted.fun_.super__Function_base._M_functor._M_unused._M_member_pointer =
       converted.fun_.super__Function_base._M_functor._M_unused._M_member_pointer &
       0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&gtest_ar_2,"ctx.mRegistry->mStorage->Get(nwk_id, nwk)",
             "PersistentStorage::Status::kSuccess",(Status *)&jsonStr,(Status *)&converted);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&jsonStr);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x782,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&jsonStr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if (jsonStr._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)jsonStr._M_dataplus._M_p + 8))();
    }
  }
  uVar7._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar_2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if (*(void **)gtest_ar_2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
        (void *)((long)gtest_ar_2.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x10)) {
      operator_delete(*(void **)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    }
    operator_delete((void *)uVar7._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  jsonStr._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)&gtest_ar_2,"nwk.mPan","0x0001",&nwk.mPan,(int *)&jsonStr);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&jsonStr);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x783,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&jsonStr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if (jsonStr._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)jsonStr._M_dataplus._M_p + 8))();
    }
  }
  uVar7._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar_2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if (*(void **)gtest_ar_2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
        (void *)((long)gtest_ar_2.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x10)) {
      operator_delete(*(void **)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    }
    operator_delete((void *)uVar7._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  gtest_ar_2._0_8_ = local_370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar_2,"opdataset get active --export ./tmp/aods.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&converted,&ctx.mInterpreter,(string *)&gtest_ar_2);
  jsonStr.field_2._M_allocated_capacity =
       (size_type)
       expr.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  jsonStr._M_string_length =
       (size_type)
       expr.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  jsonStr._M_dataplus._M_p =
       (pointer)expr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)converted.fun_.super__Function_base._M_functor._M_unused._0_8_;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)converted.fun_.super__Function_base._M_functor._8_8_;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)converted.fun_.super__Function_base._M_manager;
  converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  converted.fun_.super__Function_base._M_functor._8_8_ = 0;
  converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&jsonStr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&converted);
  if ((undefined1 *)gtest_ar_2._0_8_ != local_370) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_2,&ctx.mInterpreter,&expr);
  value.mError.mCode = gtest_ar_2._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&gtest_ar_2.message_);
  std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_358);
  if ((element_type *)local_358._M_p != local_348) {
    operator_delete(local_358._M_p);
  }
  if (gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_368) {
    operator_delete((void *)gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  bVar10 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  jsonStr._M_dataplus._M_p._0_1_ = bVar10;
  jsonStr._M_string_length = 0;
  if (!bVar10) {
    testing::Message::Message((Message *)&converted);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&jsonStr,(AssertionResult *)0x2e6ffe,"false","true"
               ,expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&json,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x787,(char *)gtest_ar_2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&json,(Message *)&converted);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&json);
    if ((undefined1 *)gtest_ar_2._0_8_ != local_370) {
      operator_delete((void *)gtest_ar_2._0_8_);
    }
    if (converted.fun_.super__Function_base._M_functor._M_unused._M_object != (void *)0x0) {
      (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object + 8))();
    }
  }
  sVar5 = jsonStr._M_string_length;
  if (jsonStr._M_string_length != 0) {
    if (*(void **)jsonStr._M_string_length != (void *)(jsonStr._M_string_length + 0x10)) {
      operator_delete(*(void **)jsonStr._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  ot::commissioner::Interpreter::PrintOrExport(&ctx.mInterpreter,&value);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"./tmp/aods.json","");
  ot::commissioner::PathExists((Error *)&gtest_ar_2,&local_1a8);
  converted.fun_.super__Function_base._M_functor._0_4_ = gtest_ar_2._0_4_;
  json._0_8_ = json._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&jsonStr,"PathExists(\"./tmp/aods.json\").GetCode()","ErrorCode::kNone",
             (ErrorCode *)&converted,(ErrorCode *)&json);
  if (gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_368) {
    operator_delete((void *)gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((char)jsonStr._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (jsonStr._M_string_length == 0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)jsonStr._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x789,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  sVar5 = jsonStr._M_string_length;
  if (jsonStr._M_string_length != 0) {
    if (*(void **)jsonStr._M_string_length != (void *)(jsonStr._M_string_length + 0x10)) {
      operator_delete(*(void **)jsonStr._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  jsonStr._M_string_length = 0;
  jsonStr.field_2._M_allocated_capacity = jsonStr.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  pp_Var1 = &converted.fun_.super__Function_base._M_manager;
  jsonStr._M_dataplus._M_p = (pointer)&jsonStr.field_2;
  converted.fun_.super__Function_base._M_functor._M_unused._M_object = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&converted,"./tmp/aods.json","");
  ot::commissioner::ReadFile((Error *)&gtest_ar_2,&jsonStr,(string *)&converted);
  uVar6 = gtest_ar_2._0_8_;
  gtest_ar_7.success_ = gtest_ar_2.success_;
  gtest_ar_7._1_3_ = gtest_ar_2._1_3_;
  local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)
       ((ulong)local_280.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.
               _vptr_MatcherBase & 0xffffffff00000000);
  gtest_ar_2._0_8_ = uVar6;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&json,"ReadFile(jsonStr, \"./tmp/aods.json\").GetCode()","ErrorCode::kNone"
             ,(ErrorCode *)&gtest_ar_7,(ErrorCode *)&local_280);
  if (gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_368) {
    operator_delete((void *)gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  if ((_Manager_type *)converted.fun_.super__Function_base._M_functor._M_unused._0_8_ != pp_Var1) {
    operator_delete(converted.fun_.super__Function_base._M_functor._M_unused._M_object);
  }
  if (json.m_type == null) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (json.m_value.object == (object_t *)0x0) {
      pbVar15 = (pointer)0x308a15;
    }
    else {
      pbVar15 = ((json.m_value.array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78c,(char *)pbVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  jVar8 = json.m_value;
  if (json.m_value.object != (object_t *)0x0) {
    pbVar15 = ((json.m_value.array)->
              super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar15 !=
        (pointer)&((json.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete(pbVar15);
    }
    operator_delete(jVar8.object);
  }
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)&gtest_ar_2,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )jsonStr._M_dataplus._M_p,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(jsonStr._M_dataplus._M_p + jsonStr._M_string_length));
  local_1b8 = (code *)0x0;
  uStack_1b0 = 0;
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&json,(input_adapter *)&gtest_ar_2,(parser_callback_t *)&local_1c8,true);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               gtest_ar_2.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
  }
  bVar10 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::contains<const_char_(&)[6],_0>(&json,(char (*) [6])0x2eb572);
  converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar10;
  converted.fun_.super__Function_base._M_functor._8_8_ = 0;
  if (!bVar10) {
    testing::Message::Message((Message *)&gtest_ar_7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&converted,
               (AssertionResult *)"json.contains(\"PanId\")","false","true",expected_predicate_value
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78e,(char *)gtest_ar_2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if ((undefined1 *)gtest_ar_2._0_8_ != local_370) {
      operator_delete((void *)gtest_ar_2._0_8_);
    }
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  uVar6 = converted.fun_.super__Function_base._M_functor._8_8_;
  if (converted.fun_.super__Function_base._M_functor._8_8_ != 0) {
    if (*(void **)converted.fun_.super__Function_base._M_functor._8_8_ !=
        (void *)(converted.fun_.super__Function_base._M_functor._8_8_ + 0x10)) {
      operator_delete(*(void **)converted.fun_.super__Function_base._M_functor._8_8_);
    }
    operator_delete((void *)uVar6);
  }
  converted.fun_.super__Function_base._M_functor._M_unused._M_object = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&converted,"PanId","");
  this_01 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(&json,(key_type *)&converted);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
             this_01);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_7,"\"0x0001\"","json.at(\"PanId\").get<std::string>().c_str()",
             "0x0001",(char *)gtest_ar_2._0_8_);
  if ((undefined1 *)gtest_ar_2._0_8_ != local_370) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if ((_Manager_type *)converted.fun_.super__Function_base._M_functor._M_unused._0_8_ != pp_Var1) {
    operator_delete(converted.fun_.super__Function_base._M_functor._M_unused._M_object);
  }
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)gtest_ar_7.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&converted,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78f,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&converted,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  uVar7._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar_7.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_7.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if (*(void **)gtest_ar_7.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
        (void *)((long)gtest_ar_7.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x10)) {
      operator_delete(*(void **)gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    }
    operator_delete((void *)uVar7._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&json);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&json.m_value.boolean,json.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)jsonStr._M_dataplus._M_p != &jsonStr.field_2) {
    operator_delete(jsonStr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value.mData._M_dataplus._M_p != paVar3) {
    operator_delete(value.mData._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value.mError.mMessage._M_dataplus._M_p != &value.mError.mMessage.field_2) {
    operator_delete(value.mError.mMessage._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
    operator_delete(nwk.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
    operator_delete(nwk.mName._M_dataplus._M_p);
  }
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_OpdatasetGetActive)
{
    TestContext ctx;
    InitContext(ctx);

    NetworkId nwk_id;
    EXPECT_EQ(ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, "", 1, 0, 0, "", 0}, nwk_id),
              PersistentStorage::Status::kSuccess);
    Network nwk;
    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(utils::Hex(nwk.mPan), "0x0000");

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetActiveDataset(_, _))
        .Times(2)
        .WillRepeatedly(DoAll(WithArg<0>([](ActiveOperationalDataset &a) {
                                  a.mExtendedPanId = ByteArray{0, 0, 0, 0, 0, 0, 0, 1};
                                  a.mPanId         = 1;
                                  a.mPresentFlags =
                                      ActiveOperationalDataset::kPanIdBit | ActiveOperationalDataset::kExtendedPanIdBit;
                              }),
                              Return(Error{})));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nwk.mPan, 0x0001);

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active --export ./tmp/aods.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.PrintOrExport(value);
    EXPECT_EQ(PathExists("./tmp/aods.json").GetCode(), ErrorCode::kNone);

    std::string jsonStr;
    EXPECT_EQ(ReadFile(jsonStr, "./tmp/aods.json").GetCode(), ErrorCode::kNone);
    nlohmann::json json = nlohmann::json::parse(jsonStr);
    EXPECT_TRUE(json.contains("PanId"));
    EXPECT_STREQ("0x0001", json.at("PanId").get<std::string>().c_str());
}